

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O0

void Bdc_ManDecPrint(Bdc_Man_t *p)

{
  int iVar1;
  Bdc_Fun_t *pNode;
  char *pcVar2;
  Bdc_Fun_t *pRoot;
  Bdc_Man_t *p_local;
  
  pNode = Bdc_Regular(p->pRoot);
  printf("F = ");
  if (pNode->Type == 1) {
    iVar1 = Bdc_IsComplement(p->pRoot);
    printf("Constant %d",(ulong)((iVar1 != 0 ^ 0xffU) & 1));
  }
  else if (pNode->Type == 2) {
    iVar1 = Bdc_IsComplement(p->pRoot);
    pcVar2 = "";
    if (iVar1 != 0) {
      pcVar2 = "!";
    }
    iVar1 = Bdc_FunId(p,pNode);
    printf("%s%d",pcVar2,(ulong)(iVar1 - 1));
  }
  else {
    iVar1 = Bdc_IsComplement(p->pRoot);
    if (iVar1 != 0) {
      printf("!(");
    }
    Bdc_ManDecPrint_rec(p,pNode);
    iVar1 = Bdc_IsComplement(p->pRoot);
    if (iVar1 != 0) {
      printf(")");
    }
  }
  printf("\n");
  return;
}

Assistant:

void Bdc_ManDecPrint( Bdc_Man_t * p )
{
    Bdc_Fun_t * pRoot = Bdc_Regular(p->pRoot);

    printf( "F = " );
    if ( pRoot->Type == BDC_TYPE_CONST1 ) // constant 0
        printf( "Constant %d", !Bdc_IsComplement(p->pRoot) );
    else if ( pRoot->Type == BDC_TYPE_PI ) // literal
        printf( "%s%d", Bdc_IsComplement(p->pRoot) ? "!" : "", Bdc_FunId(p,pRoot)-1 );
    else
    {
        if ( Bdc_IsComplement(p->pRoot) )
            printf( "!(" );
        Bdc_ManDecPrint_rec( p, pRoot );
        if ( Bdc_IsComplement(p->pRoot) )
            printf( ")" );
    }
    printf( "\n" );
}